

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_util.cc
# Opt level: O0

int64_t google::protobuf::operator/(Duration *d1,Duration *d2)

{
  uint128 lhs;
  uint128 uVar1;
  uint64_t local_50;
  int64_t result;
  uint128 value2;
  uint128 value1;
  bool local_1a;
  bool local_19;
  bool negative2;
  Duration *pDStack_18;
  bool negative1;
  Duration *d2_local;
  Duration *d1_local;
  
  pDStack_18 = d2;
  d2_local = d1;
  anon_unknown_8::ToUint128(d1,(uint128 *)&value2.hi_,&local_19);
  anon_unknown_8::ToUint128(pDStack_18,(uint128 *)&result,&local_1a);
  lhs.hi_ = value1.lo_;
  lhs.lo_ = value2.hi_;
  uVar1.hi_ = value2.lo_;
  uVar1.lo_ = result;
  uVar1 = absl::lts_20240722::operator/(lhs,uVar1);
  local_50 = absl::lts_20240722::Uint128Low64(uVar1);
  if ((local_19 & 1U) != (local_1a & 1U)) {
    local_50 = -local_50;
  }
  return local_50;
}

Assistant:

int64_t operator/(const Duration& d1, const Duration& d2) {
  bool negative1, negative2;
  absl::uint128 value1, value2;
  ToUint128(d1, &value1, &negative1);
  ToUint128(d2, &value2, &negative2);
  int64_t result = absl::Uint128Low64(value1 / value2);
  if (negative1 != negative2) {
    result = -result;
  }
  return result;
}